

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O0

void Cut_CellLoad(void)

{
  uint uVar1;
  FILE *__stream;
  Cut_CMan_t *p_00;
  char *pcVar2;
  size_t sVar3;
  Cut_Cell_t *pCell_00;
  int iVar4;
  int Length;
  Cut_Cell_t *pCell;
  Cut_CMan_t *p;
  char pString [1000];
  char *pFileName;
  FILE *pFile;
  
  __stream = fopen("cells22_daomap_iwls.txt","r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n","cells22_daomap_iwls.txt");
  }
  else {
    p_00 = Cut_CManStart();
    while (pcVar2 = fgets((char *)&p,1000,__stream), pcVar2 != (char *)0x0) {
      sVar3 = strlen((char *)&p);
      iVar4 = (int)sVar3 + -1;
      pString[(long)(int)sVar3 + -8] = '\0';
      if (iVar4 != 0) {
        pCell_00 = (Cut_Cell_t *)Extra_MmFixedEntryFetch(p_00->pMem);
        memset(pCell_00,0,0x98);
        uVar1 = Abc_Base2Log(iVar4 * 4);
        *(uint *)&pCell_00->field_0x20 = *(uint *)&pCell_00->field_0x20 & 0xfffffff0 | uVar1 & 0xf;
        pCell_00->nUsed = 1;
        Extra_ReadHexadecimal(pCell_00->uTruth,(char *)&p,*(uint *)&pCell_00->field_0x20 & 0xf);
        Cut_CellSuppMin(pCell_00);
        p_00->nTotal = p_00->nTotal + 1;
        iVar4 = Cut_CellTableLookup(p_00,pCell_00);
        if (iVar4 == 0) {
          p_00->nGood = p_00->nGood + 1;
        }
      }
    }
    printf("Read %d cells from file \"%s\". Added %d cells to the table.\n",
           (ulong)(uint)p_00->nTotal,"cells22_daomap_iwls.txt",(ulong)(uint)p_00->nGood);
    fclose(__stream);
  }
  return;
}

Assistant:

void Cut_CellLoad()
{
    FILE * pFile;
    char * pFileName = "cells22_daomap_iwls.txt";
    char pString[1000];
    Cut_CMan_t * p;
    Cut_Cell_t * pCell;
    int Length; //, i;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
   // start the manager
    p = Cut_CManStart();
    // load truth tables
    while ( fgets(pString, 1000, pFile) )
    {
        Length = strlen(pString);
        pString[Length--] = 0;
        if ( Length == 0 )
            continue;
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars = Abc_Base2Log(Length*4);
        pCell->nUsed = 1;
//        Extra_TruthCopy( pCell->uTruth, pTruth, nVars );
        Extra_ReadHexadecimal( pCell->uTruth, pString, pCell->nVars );
        Cut_CellSuppMin( pCell );
/*
        // set the elementary permutation
        for ( i = 0; i < (int)pCell->nVars; i++ )
            pCell->CanonPerm[i] = i;
        // canonicize
        pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );
*/
        // add to the table
        p->nTotal++;

//        Extra_PrintHexadecimal( stdout, pCell->uTruth, pCell->nVars ); printf( "\n" );
//        if ( p->nTotal == 500 )
//            break;

        if ( !Cut_CellTableLookup( p, pCell ) ) // new cell
            p->nGood++;
    }
    printf( "Read %d cells from file \"%s\". Added %d cells to the table.\n", p->nTotal, pFileName, p->nGood );
    fclose( pFile );
//    return p;
}